

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O3

void __thiscall SDLInputJoystickManager::~SDLInputJoystickManager(SDLInputJoystickManager *this)

{
  SDLInputJoystick *pSVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (this->Joysticks).Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pSVar1 = (this->Joysticks).Array[uVar3];
      if (pSVar1 != (SDLInputJoystick *)0x0) {
        (*(pSVar1->super_IJoystickConfig)._vptr_IJoystickConfig[1])();
        uVar2 = (this->Joysticks).Count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::~TArray(&this->Joysticks);
  return;
}

Assistant:

~SDLInputJoystickManager()
	{
		for(unsigned int i = 0;i < Joysticks.Size();i++)
			delete Joysticks[i];
	}